

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

_Bool curses_are_equal(object *obj1,object *obj2)

{
  int local_24;
  wchar_t i;
  object *obj2_local;
  object *obj1_local;
  
  if ((obj1->curses == (curse_data *)0x0) && (obj2->curses == (curse_data *)0x0)) {
    obj1_local._7_1_ = true;
  }
  else if ((obj1->curses == (curse_data *)0x0) || (obj2->curses != (curse_data *)0x0)) {
    if ((obj1->curses == (curse_data *)0x0) && (obj2->curses != (curse_data *)0x0)) {
      obj1_local._7_1_ = false;
    }
    else {
      for (local_24 = 0; local_24 < (int)(uint)z_info->curse_max; local_24 = local_24 + 1) {
        if (obj1->curses[local_24].power != obj2->curses[local_24].power) {
          return false;
        }
      }
      obj1_local._7_1_ = true;
    }
  }
  else {
    obj1_local._7_1_ = false;
  }
  return obj1_local._7_1_;
}

Assistant:

bool curses_are_equal(const struct object *obj1, const struct object *obj2)
{
	int i;

	if (!obj1->curses && !obj2->curses) return true;
	if (obj1->curses && !obj2->curses) return false;
	if (!obj1->curses && obj2->curses) return false;

	for (i = 0; i < z_info->curse_max; i++) {
		if (obj1->curses[i].power != obj2->curses[i].power) return false;
	}

	return true;
}